

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyT<int>::push_back(PropertyT<int> *this)

{
  int local_c;
  
  local_c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->data_,&local_c);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }